

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O3

void CostManagerClear(CostManager *manager)

{
  CostInterval *pCVar1;
  long lVar2;
  CostInterval *pCVar3;
  
  if (manager != (CostManager *)0x0) {
    WebPSafeFree(manager->costs_);
    WebPSafeFree(manager->cache_intervals_);
    if (manager->head_ != (CostInterval *)0x0) {
      pCVar1 = manager->head_;
      do {
        pCVar3 = pCVar1->next_;
        if (manager->intervals_ + 9 < pCVar1 || pCVar1 < manager->intervals_) {
          WebPSafeFree(pCVar1);
        }
        pCVar1 = pCVar3;
      } while (pCVar3 != (CostInterval *)0x0);
    }
    manager->head_ = (CostInterval *)0x0;
    if (manager->recycled_intervals_ != (CostInterval *)0x0) {
      pCVar1 = manager->recycled_intervals_;
      do {
        pCVar3 = pCVar1->next_;
        if (manager->intervals_ + 9 < pCVar1 || pCVar1 < manager->intervals_) {
          WebPSafeFree(pCVar1);
        }
        pCVar1 = pCVar3;
      } while (pCVar3 != (CostInterval *)0x0);
    }
    memset(manager,0,0x8178);
    pCVar1 = (CostInterval *)(manager->cost_cache_ + 0xffd);
    lVar2 = 10;
    pCVar3 = (CostInterval *)0x0;
    do {
      pCVar1[1].next_ = pCVar3;
      pCVar1 = pCVar1 + 1;
      lVar2 = lVar2 + -1;
      pCVar3 = pCVar1;
    } while (lVar2 != 0);
    manager->free_intervals_ = pCVar1;
  }
  return;
}

Assistant:

static void CostManagerClear(CostManager* const manager) {
  if (manager == NULL) return;

  WebPSafeFree(manager->costs_);
  WebPSafeFree(manager->cache_intervals_);

  // Clear the interval lists.
  DeleteIntervalList(manager, manager->head_);
  manager->head_ = NULL;
  DeleteIntervalList(manager, manager->recycled_intervals_);
  manager->recycled_intervals_ = NULL;

  // Reset pointers, count_ and cache_intervals_size_.
  memset(manager, 0, sizeof(*manager));
  CostManagerInitFreeList(manager);
}